

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

bool __thiscall CPlayer::SetSpectatorID(CPlayer *this,int SpecMode,int SpectatorID)

{
  CPlayer *pCVar1;
  bool bVar2;
  int iVar3;
  CFlag *pCVar4;
  
  if (SpecMode != 1 && this->m_SpecMode == SpecMode) {
    return false;
  }
  if (SpecMode == 1 && this->m_SpecMode == 1) {
    if (SpectatorID == -1) {
      return false;
    }
    if (this->m_SpectatorID == SpectatorID) {
      return false;
    }
    if (this->m_ClientID == SpectatorID) {
      return false;
    }
  }
  if (this->m_Team == -1) {
    if (SpecMode == 1) {
      pCVar1 = this->m_pGameServer->m_apPlayers[SpectatorID];
      if (pCVar1 == (CPlayer *)0x0) {
        return false;
      }
      if (pCVar1->m_Team == -1) {
        return false;
      }
    }
    if ((SpecMode & 0xfffffffeU) == 2) {
      pCVar4 = (CFlag *)CGameWorld::FindFirst(&this->m_pGameServer->m_World,4);
      do {
        if (pCVar4 == (CFlag *)0x0) {
          if (this->m_pSpecFlag == (CFlag *)0x0) {
            return false;
          }
LAB_0011d68d:
          this->m_SpecMode = SpecMode;
          return true;
        }
        if ((pCVar4->m_Team == 0 && SpecMode == 2) || (pCVar4->m_Team == 1 && SpecMode == 3)) {
          this->m_pSpecFlag = pCVar4;
          if (pCVar4->m_pCarrier == (CCharacter *)0x0) {
            iVar3 = -1;
          }
          else {
            iVar3 = pCVar4->m_pCarrier->m_pPlayer->m_ClientID;
          }
          this->m_SpectatorID = iVar3;
          goto LAB_0011d68d;
        }
        pCVar4 = (CFlag *)(pCVar4->super_CEntity).m_pNextTypeEntity;
      } while( true );
    }
    this->m_pSpecFlag = (CFlag *)0x0;
    this->m_SpecMode = SpecMode;
  }
  else {
    if (SpecMode != 1) {
      return false;
    }
    if (this->m_DeadSpecMode == false) {
      return false;
    }
    pCVar1 = this->m_pGameServer->m_apPlayers[SpectatorID];
    if (pCVar1 == (CPlayer *)0x0) {
      return false;
    }
    bVar2 = DeadCanFollow(this,pCVar1);
    if (!bVar2) {
      return false;
    }
    this->m_SpecMode = 1;
    this->m_pSpecFlag = (CFlag *)0x0;
  }
  this->m_SpectatorID = SpectatorID;
  return true;
}

Assistant:

bool CPlayer::SetSpectatorID(int SpecMode, int SpectatorID)
{
	if((SpecMode == m_SpecMode && SpecMode != SPEC_PLAYER) ||
		(m_SpecMode == SPEC_PLAYER && SpecMode == SPEC_PLAYER && (SpectatorID == -1 || m_SpectatorID == SpectatorID || m_ClientID == SpectatorID)))
	{
		return false;
	}

	if(m_Team == TEAM_SPECTATORS)
	{
		// check for freeview or if wanted player is playing
		if(SpecMode != SPEC_PLAYER || (SpecMode == SPEC_PLAYER && GameServer()->m_apPlayers[SpectatorID] && GameServer()->m_apPlayers[SpectatorID]->GetTeam() != TEAM_SPECTATORS))
		{
			if(SpecMode == SPEC_FLAGRED || SpecMode == SPEC_FLAGBLUE)
			{
				CFlag *pFlag = (CFlag*)GameServer()->m_World.FindFirst(CGameWorld::ENTTYPE_FLAG);
				while (pFlag)
				{
					if ((pFlag->GetTeam() == TEAM_RED && SpecMode == SPEC_FLAGRED) || (pFlag->GetTeam() == TEAM_BLUE && SpecMode == SPEC_FLAGBLUE))
					{
						m_pSpecFlag = pFlag;
						if (pFlag->GetCarrier())
							m_SpectatorID = pFlag->GetCarrier()->GetPlayer()->GetCID();
						else
							m_SpectatorID = -1;
						break;
					}
					pFlag = (CFlag*)pFlag->TypeNext();
				}
				if (!m_pSpecFlag)
					return false;
				m_SpecMode = SpecMode;
				return true;
			}
			m_pSpecFlag = 0;
			m_SpecMode = SpecMode;
			m_SpectatorID = SpectatorID;
			return true;
		}
	}
	else if(m_DeadSpecMode)
	{
		// check if wanted player can be followed
		if(SpecMode == SPEC_PLAYER && GameServer()->m_apPlayers[SpectatorID] && DeadCanFollow(GameServer()->m_apPlayers[SpectatorID]))
		{
			m_SpecMode = SpecMode;
			m_pSpecFlag = 0;
			m_SpectatorID = SpectatorID;
			return true;
		}
	}

	return false;
}